

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

int ps_alignment_add_word(ps_alignment_t *al,int32 wid,int start,int duration)

{
  uint uVar1;
  ps_alignment_entry_t *ppVar2;
  
  ppVar2 = ps_alignment_vector_grow_one(&al->word);
  if (ppVar2 == (ps_alignment_entry_t *)0x0) {
    uVar1 = 0;
  }
  else {
    (ppVar2->id).wid = wid;
    ppVar2->start = start;
    ppVar2->duration = duration;
    ppVar2->score = 0;
    ppVar2->parent = -1;
    ppVar2->child = -1;
    uVar1 = (uint)(al->word).n_ent;
  }
  return uVar1;
}

Assistant:

int
ps_alignment_add_word(ps_alignment_t *al,
                      int32 wid, int start, int duration)
{
    ps_alignment_entry_t *ent;

    if ((ent = ps_alignment_vector_grow_one(&al->word)) == NULL)
        return 0;
    ent->id.wid = wid;
    ent->start = start;
    ent->duration = duration;
    ent->score = 0;
    ent->parent = PS_ALIGNMENT_NONE;
    ent->child = PS_ALIGNMENT_NONE;

    return al->word.n_ent;
}